

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O0

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ConstantValue,void>,std::equal_to<slang::ConstantValue>,slang::detail::hashing::StackAllocator<std::pair<slang::ConstantValue_const,slang::ast::Expression_const*>,192ul,16ul>>
::
unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ConstantValue,slang::ast::Expression_const*&>
          (table_core<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
           *this,size_t hash,try_emplace_args_t *args,ConstantValue *args_1,Expression **args_2)

{
  long in_RSI;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>_>
  *in_RDI;
  value_type_pointer in_R9;
  locator *it;
  arrays_type new_arrays_;
  arrays_type *in_stack_ffffffffffffff58;
  size_t in_stack_ffffffffffffff60;
  try_emplace_args_t *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffa8;
  pair<const_slang::ConstantValue,_const_slang::ast::Expression_*> *in_stack_ffffffffffffffb0;
  StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>
  in_stack_ffffffffffffffb8;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
  *in_stack_ffffffffffffffc0;
  arrays_type *in_stack_ffffffffffffffc8;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
  *in_stack_ffffffffffffffd0;
  
  table_core<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
  ::new_arrays_for_growth
            ((table_core<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
              *)&stack0xffffffffffffffb8);
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>_>
  ::table_locator(in_RDI);
  table_core<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
  ::position_for(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ConstantValue,slang::ast::Expression_const*&>
            (in_stack_ffffffffffffffc0,(arrays_type *)in_stack_ffffffffffffffb8.storage,
             (size_t)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             (ConstantValue *)in_stack_ffffffffffffffd0,(Expression **)in_R9);
  in_RDI->pg = (group15<boost::unordered::detail::foa::plain_integral> *)in_stack_ffffffffffffffa0;
  *(size_t *)&in_RDI->n = in_stack_ffffffffffffffa8;
  in_RDI->p = in_stack_ffffffffffffffb0;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::ConstantValue,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ConstantValue,_const_slang::ast::Expression_*>,_192UL,_16UL>_>
  ::unchecked_rehash(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  *(long *)(in_RSI + 0x30) = *(long *)(in_RSI + 0x30) + 1;
  return in_RDI;
}

Assistant:

BOOST_NOINLINE locator unchecked_emplace_with_rehash(std::size_t hash, Args&&... args) {
        auto new_arrays_ = new_arrays_for_growth();
        locator it;
        BOOST_TRY {
            /* strong exception guarantee -> try insertion before rehash */
            it = nosize_unchecked_emplace_at(new_arrays_, position_for(hash, new_arrays_), hash,
                                             std::forward<Args>(args)...);
        }